

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O0

void PrintResults(CEExecOptions *opts,CESkyCoord *results)

{
  long *plVar1;
  long *in_RSI;
  CLOptions *in_RDI;
  double dVar2;
  string *in_stack_fffffffffffffe40;
  CLOptions *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  CEDateType date_format;
  allocator *paVar3;
  double in_stack_fffffffffffffe58;
  CEDate *in_stack_fffffffffffffe60;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [64];
  CEAngle local_80 [2];
  undefined1 local_60 [64];
  CEAngle local_20;
  long *local_10;
  CLOptions *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  printf("\n");
  printf("******************************************\n");
  printf("* Results of CIRS -> Galactic conversion *\n");
  printf("******************************************\n");
  printf("Galactic Coordinates (output)\n");
  plVar1 = local_10;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,date_format);
  (**(code **)(*plVar1 + 0x18))(&local_20,plVar1,local_60);
  dVar2 = CEAngle::Deg(&local_20);
  printf("    Galactic Lon.: %f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x136f09);
  CEDate::~CEDate((CEDate *)0x136f16);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,date_format);
  (**(code **)(*local_10 + 0x20))(local_80,local_10,local_c0);
  dVar2 = CEAngle::Deg(local_80);
  printf("    Galactic Lat.: %+f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x136f91);
  CEDate::~CEDate((CEDate *)0x136f9e);
  printf("CIRS Coordinates (input)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"ra",&local_e1);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  printf("    Right Ascension: %f degrees\n",dVar2);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"dec",&local_109);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  printf("    Declination    : %+f degrees\n",dVar2);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  paVar3 = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"juliandate",paVar3);
  dVar2 = CLOptions::AsDouble(local_8,in_stack_fffffffffffffe40);
  printf("    Julian Date    : %f\n",dVar2);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  printf("\n");
  return;
}

Assistant:

void PrintResults(CEExecOptions&    opts, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of CIRS -> Galactic conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Galactic Coordinates (output)\n") ;
    std::printf("    Galactic Lon.: %f degrees\n", results.XCoord().Deg()) ;
    std::printf("    Galactic Lat.: %+f degrees\n", results.YCoord().Deg()) ;
    std::printf("CIRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %f degrees\n", opts.AsDouble("ra")) ;
    std::printf("    Declination    : %+f degrees\n", opts.AsDouble("dec")) ;
    std::printf("    Julian Date    : %f\n", opts.AsDouble("juliandate")) ;
    std::printf("\n") ;
}